

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O3

void __thiscall QToolBarLayout::~QToolBarLayout(QToolBarLayout *this)

{
  ~QToolBarLayout((QToolBarLayout *)&this[-1].extension);
  operator_delete(&this[-1].extension,0x88);
  return;
}

Assistant:

QToolBarLayout::~QToolBarLayout()
{
    while (!items.isEmpty()) {
        QToolBarItem *item = items.takeFirst();
        if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction*>(item->action)) {
            if (item->customWidget)
                widgetAction->releaseWidget(item->widget());
        }
        delete item;
    }
}